

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O1

void undo_find_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Object sel_widget;
  Am_Value_List old_val;
  Am_Value_List new_val;
  Am_Object local_30;
  Am_Value_List local_28;
  Am_Value_List local_18;
  
  pAVar1 = Am_Object::Get(cmd,0x16c,0);
  Am_Value_List::Am_Value_List(&local_28,pAVar1);
  pAVar1 = Am_Object::Get(cmd,0x197,0);
  Am_Object::Am_Object(&local_30,pAVar1);
  pAVar1 = Am_Object::Get(&local_30,0x169,0);
  Am_Value_List::Am_Value_List(&local_18,pAVar1);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_28);
  Am_Object::Set(&local_30,0x169,pAVar2,0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_18);
  Am_Object::Set(cmd,0x16c,pAVar2,0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_28);
  Am_Object::Set(cmd,0x169,pAVar2,0);
  Am_Value_List::~Am_Value_List(&local_18);
  Am_Object::~Am_Object(&local_30);
  Am_Value_List::~Am_Value_List(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, undo_find, (Am_Object cmd))
{
  Am_Value_List old_val = cmd.Get(Am_OLD_VALUE);
  Am_Object sel_widget = cmd.Get(Am_SELECTION_WIDGET);
  Am_Value_List new_val = sel_widget.Get(Am_VALUE);
  sel_widget.Set(Am_VALUE, old_val);
  cmd.Set(Am_OLD_VALUE, new_val);
  cmd.Set(Am_VALUE, old_val);
}